

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O2

void absl::lts_20240722::container_internal::
     Deallocate<8ul,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
               (allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                *alloc,void *p,size_t n)

{
  if (n != 0) {
    operator_delete(p,n + 7 & 0xfffffffffffffff8);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/container_memory.h"
                ,0x58,
                "void absl::container_internal::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  AT::deallocate(my_mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}